

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool detect_monsters(wchar_t y_dist,wchar_t x_dist,monster_predicate pred)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster *mon_00;
  monster_lore_conflict *pmVar4;
  monster_lore *lore;
  monster *mon;
  wchar_t wStack_30;
  _Bool monsters;
  wchar_t y2;
  wchar_t y1;
  wchar_t x2;
  wchar_t x1;
  wchar_t y;
  wchar_t x;
  wchar_t i;
  monster_predicate pred_local;
  wchar_t x_dist_local;
  wchar_t y_dist_local;
  
  mon._3_1_ = false;
  wStack_30 = (player->grid).y - y_dist;
  mon._4_4_ = (player->grid).y + y_dist;
  y1 = (player->grid).x - x_dist;
  y2 = (player->grid).x + x_dist;
  if (wStack_30 < L'\0') {
    wStack_30 = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (cave->height + L'\xffffffff' < mon._4_4_) {
    mon._4_4_ = cave->height + L'\xffffffff';
  }
  if (cave->width + L'\xffffffff' < y2) {
    y2 = cave->width + L'\xffffffff';
  }
  for (y = L'\x01'; wVar3 = cave_monster_max(cave), y < wVar3; y = y + L'\x01') {
    mon_00 = (monster *)cave_monster(cave,y);
    if (mon_00->race != (monster_race *)0x0) {
      wVar3 = (mon_00->grid).y;
      wVar1 = (mon_00->grid).x;
      if ((((y1 <= wVar1) && (wStack_30 <= wVar3)) && (wVar1 <= y2)) &&
         (((wVar3 <= mon._4_4_ && (_Var2 = (*pred)(mon_00), _Var2)) &&
          (_Var2 = monster_is_camouflaged(mon_00), !_Var2)))) {
        flag_on_dbg(mon_00->mflag,2,5,"mon->mflag","MFLAG_MARK");
        flag_on_dbg(mon_00->mflag,2,4,"mon->mflag","MFLAG_SHOW");
        _Var2 = monster_is_invisible(mon_00);
        if (_Var2) {
          pmVar4 = get_lore(mon_00->race);
          flag_on_dbg(pmVar4->flags,0xb,0x28,"lore->flags","RF_INVISIBLE");
        }
        if (player->upkeep->monster_race == mon_00->race) {
          player->upkeep->redraw = player->upkeep->redraw | 0x100000;
        }
        update_mon(mon_00,(chunk *)cave,false);
        mon._3_1_ = true;
      }
    }
  }
  return mon._3_1_;
}

Assistant:

static bool detect_monsters(int y_dist, int x_dist, monster_predicate pred)
{
	int i, x, y;
	int x1, x2, y1, y2;

	bool monsters = false;

	/* Set the detection area */
	y1 = player->grid.y - y_dist;
	y2 = player->grid.y + y_dist;
	x1 = player->grid.x - x_dist;
	x2 = player->grid.x + x_dist;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Location */
		y = mon->grid.y;
		x = mon->grid.x;

		/* Only detect nearby monsters */
		if (x < x1 || y < y1 || x > x2 || y > y2) continue;

		/* Detect all appropriate, obvious monsters */
		if (pred(mon) && !monster_is_camouflaged(mon)) {
			/* Detect the monster */
			mflag_on(mon->mflag, MFLAG_MARK);
			mflag_on(mon->mflag, MFLAG_SHOW);

			/* Note invisible monsters */
			if (monster_is_invisible(mon)) {
				struct monster_lore *lore = get_lore(mon->race);
				rf_on(lore->flags, RF_INVISIBLE);
			}

			/* Update monster recall window */
			if (player->upkeep->monster_race == mon->race)
				/* Redraw stuff */
				player->upkeep->redraw |= (PR_MONSTER);

			/* Update the monster */
			update_mon(mon, cave, false);

			/* Detect */
			monsters = true;
		}
	}

	return monsters;
}